

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> * __thiscall
Corrade::Utility::Configuration::parse
          (pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>
           *__return_storage_ptr__,Configuration *this,StringView in,ConfigurationGroup *group,
          StringView fullPath)

{
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  StringView fullPath_00;
  StringView a;
  StringView in_00;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  ostream *poVar6;
  reference pvVar7;
  size_t sVar8;
  char *pcVar9;
  ConfigurationGroup *pCVar10;
  BasicStringView<const_char> *pBVar11;
  StringView SVar12;
  BasicStringView<const_char> BVar13;
  void *local_540;
  char *local_538;
  void *local_530;
  string local_528 [32];
  char *local_508;
  void *local_500;
  BasicStringView<const_char> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  BasicStringView<const_char> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  undefined1 local_498 [8];
  Value item_1;
  void *local_450;
  undefined1 local_448 [8];
  Array3<Containers::StringView> keyValue;
  undefined1 local_3f8 [8];
  Value item;
  void *local_3b0;
  EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL> local_3a8;
  Configuration *local_3a0;
  char *local_398;
  EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL> local_390;
  StringView local_388;
  char *local_378;
  char *pcStack_370;
  String local_360;
  char *local_348;
  size_t sStack_340;
  Configuration *local_338;
  char *pcStack_330;
  pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> local_320;
  undefined1 local_308 [8];
  pair<Corrade::Containers::ArrayView<const_char>,_const_char_*> parsed_1;
  EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL> local_2d0;
  Configuration *local_2c8;
  char *local_2c0;
  BasicStringView<const_char> local_2b8;
  char *local_2a8;
  char *pcStack_2a0;
  pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*> local_290;
  undefined1 local_278 [8];
  pair<Corrade::Containers::ArrayView<const_char>,_const_char_*> parsed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  int local_22c;
  char *local_228;
  void *local_220;
  undefined1 local_218 [8];
  StringView groupEnd;
  undefined1 local_1f0 [8];
  StringView nextSubGroup;
  Group g;
  char *local_1a8;
  void *local_1a0;
  BasicStringView<const_char> local_198;
  undefined1 auStack_188 [8];
  StringView nextGroup;
  void *local_170;
  EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U> local_168;
  UnderlyingType local_164;
  BasicStringView<const_char> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  BasicStringView<const_char> local_130;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_119;
  Error local_118;
  StringView local_f0;
  BasicStringView<const_char> local_e0;
  StringView local_d0;
  EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U> local_bc;
  BasicStringView<const_char> local_b8;
  BasicStringView<const_char> local_a8;
  undefined1 local_98 [8];
  StringView end;
  StringView buffer;
  StringView currentLine;
  bool multiLineValue;
  Flags local_51;
  Error local_50;
  ConfigurationGroup *local_28;
  ConfigurationGroup *group_local;
  Configuration *this_local;
  StringView in_local;
  
  in_local._data = (char *)in._sizePlusFlags;
  this_local = (Configuration *)in._data;
  local_28 = group;
  group_local = &this->super_ConfigurationGroup;
  bVar1 = Containers::BasicStringView::operator_cast_to_bool((BasicStringView *)&fullPath);
  if ((bVar1) && (bVar1 = Containers::BasicStringView<const_char>::hasSuffix(&fullPath,'/'), !bVar1)
     ) {
    poVar6 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_51);
    Error::Error(&local_50,poVar6,local_51);
    Debug::operator<<(&local_50.super_Debug,
                      "Assertion !fullPath || fullPath.hasSuffix(\'/\') failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Configuration.cpp:125"
                     );
    Error::~Error(&local_50);
    abort();
  }
  bVar1 = false;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          bVar2 = Containers::BasicStringView<const_char>::isEmpty
                            ((BasicStringView<const_char> *)&this_local);
          pcVar5 = in_local._data;
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            if (bVar1) {
              local_530 = (void *)0x0;
              local_538 = "missing closing quotes for a multi-line value";
              std::pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>::
              pair<std::nullptr_t,_true>(__return_storage_ptr__,&local_530,&local_538);
              return __return_storage_ptr__;
            }
            local_540 = (void *)0x0;
            std::pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>::
            pair<Corrade::Containers::BasicStringView<const_char>_&,_std::nullptr_t,_true>
                      (__return_storage_ptr__,(BasicStringView<const_char> *)&this_local,&local_540)
            ;
            return __return_storage_ptr__;
          }
          buffer._sizePlusFlags = (size_t)this_local;
          end._sizePlusFlags = (size_t)this_local;
          buffer._data = in_local._data;
          pcVar3 = Containers::BasicStringView<const_char>::end
                             ((BasicStringView<const_char> *)&this_local);
          _local_98 = Containers::BasicStringView<const_char>::findOr
                                ((BasicStringView<const_char> *)&this_local,'\n',pcVar3);
          pcVar3 = Containers::BasicStringView<const_char>::begin
                             ((BasicStringView<const_char> *)local_98);
          local_a8 = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                               ((BasicStringView<const_char> *)&this_local,pcVar3);
          end._sizePlusFlags = (size_t)local_a8._data;
          buffer._data = (char *)local_a8._sizePlusFlags;
          pcVar3 = Containers::BasicStringView<const_char>::end
                             ((BasicStringView<const_char> *)local_98);
          local_b8 = Containers::BasicStringView<const_char>::suffix
                               ((BasicStringView<const_char> *)&this_local,pcVar3);
          this_local = (Configuration *)local_b8._data;
          in_local._data = (char *)local_b8._sizePlusFlags;
          bVar2 = Containers::BasicStringView<const_char>::hasSuffix
                            ((BasicStringView<const_char> *)&end._sizePlusFlags,'\r');
          if (bVar2) {
            Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::EnumSet
                      (&local_bc,WindowsEol);
            Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::
            operator|=(&this->_flags,local_bc);
          }
          if (!bVar1) break;
          local_e0._data = (char *)end._sizePlusFlags;
          local_e0._sizePlusFlags = (size_t)buffer._data;
          local_d0 = Containers::BasicStringView<const_char>::trimmed(&local_e0);
          local_f0 = Containers::Literals::StringLiterals::operator____s("\"\"\"",3);
          bVar2 = Containers::operator==(local_d0,local_f0);
          if (bVar2) {
            std::
            vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
            ::back(&local_28->_values);
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              std::
              vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
              ::back(&local_28->_values);
              pcVar5 = (char *)std::__cxx11::string::back();
              if (*pcVar5 != '\n') {
                poVar6 = Error::defaultOutput();
                Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                          (&local_119);
                Error::Error(&local_118,poVar6,(Flags)local_119._value);
                Debug::operator<<(&local_118.super_Debug,
                                  "Assertion group->_values.back().value.back() == \'\\n\' failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Configuration.cpp:148"
                                 );
                Error::~Error(&local_118);
                abort();
              }
              pvVar7 = std::
                       vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                       ::back(&local_28->_values);
              std::
              vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
              ::back(&local_28->_values);
              std::__cxx11::string::size();
              std::__cxx11::string::resize((ulong)&pvVar7->value);
            }
            bVar1 = false;
          }
          else {
            bVar2 = Containers::BasicStringView<const_char>::hasSuffix
                              ((BasicStringView<const_char> *)&end._sizePlusFlags,'\r');
            if (bVar2) {
              local_130 = Containers::BasicStringView<const_char>::exceptSuffix
                                    ((BasicStringView<const_char> *)&end._sizePlusFlags,1);
              end._sizePlusFlags = (size_t)local_130._data;
              buffer._data = (char *)local_130._sizePlusFlags;
            }
            Containers::BasicStringView::operator_cast_to_string
                      (&local_150,(BasicStringView *)&end._sizePlusFlags);
            pvVar7 = std::
                     vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                     ::back(&local_28->_values);
            std::__cxx11::string::operator+=((string *)&pvVar7->value,(string *)&local_150);
            std::__cxx11::string::~string((string *)&local_150);
            pvVar7 = std::
                     vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
                     ::back(&local_28->_values);
            std::__cxx11::string::operator+=((string *)&pvVar7->value,'\n');
          }
        }
        local_160 = Containers::BasicStringView<const_char>::trimmed
                              ((BasicStringView<const_char> *)&end._sizePlusFlags);
        end._sizePlusFlags = (size_t)local_160._data;
        buffer._data = (char *)local_160._sizePlusFlags;
        bVar2 = Containers::BasicStringView::operator_cast_to_bool
                          ((BasicStringView *)&end._sizePlusFlags);
        if (bVar2) break;
        Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::EnumSet
                  (&local_168,SkipComments);
        local_164 = (UnderlyingType)
                    Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>
                    ::operator&(&this->_flags,local_168);
        bVar2 = Containers::EnumSet::operator_cast_to_bool((EnumSet *)&local_164);
        if (!bVar2) {
          bVar2 = Containers::BasicStringView::operator_cast_to_bool((BasicStringView *)&this_local)
          ;
          if (bVar2) {
            std::
            vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
            ::emplace_back<>(&local_28->_values);
          }
        }
      }
      bVar2 = Containers::BasicStringView<const_char>::hasPrefix
                        ((BasicStringView<const_char> *)&end._sizePlusFlags,'[');
      if (!bVar2) break;
      bVar2 = Containers::BasicStringView<const_char>::hasSuffix
                        ((BasicStringView<const_char> *)&end._sizePlusFlags,']');
      if (!bVar2) {
        local_170 = (void *)0x0;
        nextGroup._sizePlusFlags = (size_t)anon_var_dwarf_c0841;
        std::pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>::
        pair<std::nullptr_t,_true>
                  (__return_storage_ptr__,&local_170,(char **)&nextGroup._sizePlusFlags);
        return __return_storage_ptr__;
      }
      sVar8 = Containers::BasicStringView<const_char>::size
                        ((BasicStringView<const_char> *)&end._sizePlusFlags);
      local_198 = Containers::BasicStringView<const_char>::slice
                            ((BasicStringView<const_char> *)&end._sizePlusFlags,1,sVar8 - 1);
      _auStack_188 = Containers::BasicStringView<const_char>::trimmed(&local_198);
      bVar2 = Containers::BasicStringView::operator_cast_to_bool((BasicStringView *)auStack_188);
      if (!bVar2) {
        local_1a0 = (void *)0x0;
        local_1a8 = "empty group name";
        std::pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>::
        pair<std::nullptr_t,_true>(__return_storage_ptr__,&local_1a0,&local_1a8);
        return __return_storage_ptr__;
      }
      bVar2 = Containers::BasicStringView<const_char>::hasPrefix
                        ((BasicStringView<const_char> *)auStack_188,fullPath);
      if (!bVar2) {
        local_3b0 = (void *)0x0;
        std::pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>::
        pair<std::nullptr_t,_true>
                  (__return_storage_ptr__,(BasicStringView<const_char> *)&buffer._sizePlusFlags,
                   &local_3b0);
        return __return_storage_ptr__;
      }
      ConfigurationGroup::Group::Group((Group *)&nextSubGroup._sizePlusFlags);
      groupEnd._sizePlusFlags = (size_t)fullPath._data;
      BVar13 = Containers::BasicStringView<const_char>::exceptPrefix
                         ((BasicStringView<const_char> *)auStack_188,fullPath);
      nextSubGroup._data = (char *)BVar13._sizePlusFlags;
      local_1f0 = (undefined1  [8])BVar13._data;
      BVar13 = Containers::BasicStringView<const_char>::find
                         ((BasicStringView<const_char> *)local_1f0,'/');
      groupEnd._data = (char *)BVar13._sizePlusFlags;
      local_218 = (undefined1  [8])BVar13._data;
      bVar2 = Containers::BasicStringView::operator_cast_to_bool((BasicStringView *)local_218);
      if (bVar2) {
        pcVar3 = Containers::BasicStringView<const_char>::begin
                           ((BasicStringView<const_char> *)local_218);
        pcVar9 = Containers::BasicStringView<const_char>::begin
                           ((BasicStringView<const_char> *)local_1f0);
        if (pcVar3 == pcVar9) {
          local_220 = (void *)0x0;
          local_228 = "empty subgroup name";
          std::pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>::
          pair<std::nullptr_t,_true>(__return_storage_ptr__,&local_220,&local_228);
          local_22c = 1;
        }
        else {
          pcVar3 = Containers::BasicStringView<const_char>::begin
                             ((BasicStringView<const_char> *)local_218);
          BVar13 = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                             ((BasicStringView<const_char> *)local_1f0,pcVar3);
          parsed.second = BVar13._data;
          Containers::BasicStringView::operator_cast_to_string
                    (&local_250,(BasicStringView *)&parsed.second);
          std::__cxx11::string::operator=
                    ((string *)&nextSubGroup._sizePlusFlags,(string *)&local_250);
          std::__cxx11::string::~string((string *)&local_250);
          pCVar10 = (ConfigurationGroup *)operator_new(0x38);
          ConfigurationGroup::ConfigurationGroup
                    (pCVar10,(this->super_ConfigurationGroup)._configuration);
          std::
          vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
          ::push_back(&local_28->_groups,(value_type *)&nextSubGroup._sizePlusFlags);
          local_2a8 = (char *)buffer._sizePlusFlags;
          pcStack_2a0 = pcVar5;
          pcVar5 = Containers::BasicStringView<const_char>::end
                             ((BasicStringView<const_char> *)local_218);
          BVar13 = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                             ((BasicStringView<const_char> *)auStack_188,pcVar5);
          SVar12._sizePlusFlags = (size_t)pcStack_2a0;
          SVar12._data = local_2a8;
          local_2b8 = BVar13;
          parse(&local_290,this,SVar12,pCVar10,BVar13);
          std::pair<Corrade::Containers::ArrayView<const_char>,_const_char_*>::
          pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*,_true>
                    ((pair<Corrade::Containers::ArrayView<const_char>,_const_char_*> *)local_278,
                     &local_290);
          if (parsed.first._size == 0) {
            Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::
            EnumSet(&local_2d0);
            Containers::BasicStringView<char_const>::
            BasicStringView<Corrade::Containers::ArrayView<char_const>&,Corrade::Containers::ArrayView<char_const>>
                      ((BasicStringView<char_const> *)&local_2c8,(ArrayView<const_char> *)local_278,
                       (StringViewFlags)local_2d0._value);
            this_local = local_2c8;
            in_local._data = local_2c0;
            goto LAB_001ac134;
          }
          std::pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>::
          pair<Corrade::Containers::ArrayView<const_char>,_const_char_*,_true>
                    (__return_storage_ptr__,
                     (pair<Corrade::Containers::ArrayView<const_char>,_const_char_*> *)local_278);
          local_22c = 1;
        }
      }
      else {
        Containers::BasicStringView::operator_cast_to_string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &parsed_1.second,(BasicStringView *)local_1f0);
        std::__cxx11::string::operator=
                  ((string *)&nextSubGroup._sizePlusFlags,(string *)&parsed_1.second);
        std::__cxx11::string::~string((string *)&parsed_1.second);
        pCVar10 = (ConfigurationGroup *)operator_new(0x38);
        ConfigurationGroup::ConfigurationGroup
                  (pCVar10,(this->super_ConfigurationGroup)._configuration);
        std::
        vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
        ::push_back(&local_28->_groups,(value_type *)&nextSubGroup._sizePlusFlags);
        local_338 = this_local;
        pcStack_330 = in_local._data;
        local_378 = (char *)auStack_188;
        pcStack_370 = nextGroup._data;
        SVar12 = Containers::Literals::StringLiterals::operator____s("/",1);
        a._sizePlusFlags = (size_t)pcStack_370;
        a._data = local_378;
        local_388 = SVar12;
        Containers::operator+(&local_360,a,SVar12);
        Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
                  (&local_390);
        Containers::BasicStringView<char_const>::
        BasicStringView<Corrade::Containers::String,Corrade::Containers::ArrayView<char_const>>
                  ((BasicStringView<char_const> *)&local_348,&local_360,
                   (StringViewFlags)local_390._value);
        in_00._sizePlusFlags = (size_t)pcStack_330;
        in_00._data = (char *)local_338;
        fullPath_00._sizePlusFlags = sStack_340;
        fullPath_00._data = local_348;
        parse(&local_320,this,in_00,pCVar10,fullPath_00);
        std::pair<Corrade::Containers::ArrayView<const_char>,_const_char_*>::
        pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*,_true>
                  ((pair<Corrade::Containers::ArrayView<const_char>,_const_char_*> *)local_308,
                   &local_320);
        Containers::String::~String(&local_360);
        if (parsed_1.first._size == 0) {
          Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
                    (&local_3a8);
          Containers::BasicStringView<char_const>::
          BasicStringView<Corrade::Containers::ArrayView<char_const>&,Corrade::Containers::ArrayView<char_const>>
                    ((BasicStringView<char_const> *)&local_3a0,(ArrayView<const_char> *)local_308,
                     (StringViewFlags)local_3a8._value);
          this_local = local_3a0;
          in_local._data = local_398;
LAB_001ac134:
          local_22c = 0;
        }
        else {
          std::pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>::
          pair<Corrade::Containers::ArrayView<const_char>,_const_char_*,_true>
                    (__return_storage_ptr__,
                     (pair<Corrade::Containers::ArrayView<const_char>,_const_char_*> *)local_308);
          local_22c = 1;
        }
      }
      ConfigurationGroup::Group::~Group((Group *)&nextSubGroup._sizePlusFlags);
joined_r0x001ac152:
      if (local_22c != 0) {
        return __return_storage_ptr__;
      }
    }
    pcVar5 = Containers::BasicStringView<const_char>::operator[]
                       ((BasicStringView<const_char> *)&end._sizePlusFlags,0);
    if (*pcVar5 != '#') {
      pcVar5 = Containers::BasicStringView<const_char>::operator[]
                         ((BasicStringView<const_char> *)&end._sizePlusFlags,0);
      if (*pcVar5 != ';') {
        Containers::BasicStringView<const_char>::partition
                  ((Array3<BasicStringView<const_char>_> *)local_448,
                   (BasicStringView<const_char> *)&end._sizePlusFlags,'=');
        pBVar11 = Containers::StaticArray<3UL,_Corrade::Containers::BasicStringView<const_char>_>::
                  operator[]<int,_0>((Array3<BasicStringView<const_char>_> *)local_448,1);
        bVar2 = Containers::BasicStringView::operator_cast_to_bool((BasicStringView *)pBVar11);
        if (bVar2) {
          ConfigurationGroup::Value::Value((Value *)local_498);
          pBVar11 = Containers::StaticArray<3UL,_Corrade::Containers::BasicStringView<const_char>_>
                    ::operator[]<int,_0>
                              ((StaticArray<3UL,_Corrade::Containers::BasicStringView<const_char>_>
                                *)local_448,0);
          BVar13 = Containers::BasicStringView<const_char>::trimmed(pBVar11);
          local_4c8 = BVar13;
          Containers::BasicStringView::operator_cast_to_string
                    (&local_4b8,(BasicStringView *)&local_4c8);
          std::__cxx11::string::operator=((string *)local_498,(string *)&local_4b8);
          std::__cxx11::string::~string((string *)&local_4b8);
          pBVar11 = Containers::StaticArray<3UL,_Corrade::Containers::BasicStringView<const_char>_>
                    ::operator[]<int,_0>
                              ((StaticArray<3UL,_Corrade::Containers::BasicStringView<const_char>_>
                                *)local_448,2);
          BVar13 = Containers::BasicStringView<const_char>::trimmed(pBVar11);
          local_4f8 = BVar13;
          Containers::BasicStringView::operator_cast_to_string
                    (&local_4e8,(BasicStringView *)&local_4f8);
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (item_1.key.field_2._M_local_buf + 8);
          std::__cxx11::string::operator=((string *)__lhs,(string *)&local_4e8);
          std::__cxx11::string::~string((string *)&local_4e8);
          bVar2 = std::operator==(__lhs,"\"\"\"");
          if (bVar2) {
            std::__cxx11::string::operator=((string *)(item_1.key.field_2._M_local_buf + 8),"");
            bVar1 = true;
LAB_001ac606:
            std::
            vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
            ::push_back(&local_28->_values,(value_type *)local_498);
            local_22c = 0;
          }
          else {
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) != 0) goto LAB_001ac606;
            pcVar5 = (char *)std::__cxx11::string::operator[]
                                       ((ulong)((long)&item_1.key.field_2 + 8));
            if (*pcVar5 != '\"') goto LAB_001ac606;
            uVar4 = std::__cxx11::string::size();
            if (1 < uVar4) {
              std::__cxx11::string::size();
              pcVar5 = (char *)std::__cxx11::string::operator[]
                                         ((ulong)((long)&item_1.key.field_2 + 8));
              if (*pcVar5 == '\"') {
                std::__cxx11::string::size();
                std::__cxx11::string::substr
                          ((ulong)local_528,(ulong)((long)&item_1.key.field_2 + 8));
                std::__cxx11::string::operator=
                          ((string *)(item_1.key.field_2._M_local_buf + 8),local_528);
                std::__cxx11::string::~string(local_528);
                goto LAB_001ac606;
              }
            }
            local_500 = (void *)0x0;
            local_508 = "missing closing quote for a value";
            std::pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>::
            pair<std::nullptr_t,_true>(__return_storage_ptr__,&local_500,&local_508);
            local_22c = 1;
          }
          ConfigurationGroup::Value::~Value((Value *)local_498);
        }
        else {
          local_450 = (void *)0x0;
          item_1.value.field_2._8_8_ = anon_var_dwarf_c0899;
          std::pair<Corrade::Containers::BasicStringView<const_char>,_const_char_*>::
          pair<std::nullptr_t,_true>
                    (__return_storage_ptr__,&local_450,(char **)((long)&item_1.value.field_2 + 8));
          local_22c = 1;
        }
        Containers::StaticArray<3UL,_Corrade::Containers::BasicStringView<const_char>_>::
        ~StaticArray((StaticArray<3UL,_Corrade::Containers::BasicStringView<const_char>_> *)
                     local_448);
        goto joined_r0x001ac152;
      }
    }
    Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::EnumSet
              ((EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U> *)
               ((long)&item.value.field_2 + 8),SkipComments);
    item.value.field_2._12_4_ =
         Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::operator&
                   (&this->_flags,
                    (EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>)
                    item.value.field_2._8_4_);
    bVar2 = Containers::EnumSet::operator_cast_to_bool
                      ((EnumSet *)(item.value.field_2._M_local_buf + 0xc));
    if (!bVar2) {
      ConfigurationGroup::Value::Value((Value *)local_3f8);
      Containers::BasicStringView::operator_cast_to_string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&keyValue.
                         super_StaticArrayDataFor<3UL,_Corrade::Containers::BasicStringView<const_char>_>
                         .field_0 + 0x28),(BasicStringView *)&end._sizePlusFlags);
      this_00 = (string *)
                ((long)&keyValue.
                        super_StaticArrayDataFor<3UL,_Corrade::Containers::BasicStringView<const_char>_>
                        .field_0 + 0x28);
      std::__cxx11::string::operator=((string *)(item.key.field_2._M_local_buf + 8),this_00);
      std::__cxx11::string::~string(this_00);
      std::
      vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
      ::push_back(&local_28->_values,(value_type *)local_3f8);
      ConfigurationGroup::Value::~Value((Value *)local_3f8);
    }
  } while( true );
}

Assistant:

std::pair<Containers::StringView, const char*> Configuration::parse(Containers::StringView in, ConfigurationGroup* group, const Containers::StringView fullPath) {
    CORRADE_INTERNAL_ASSERT(!fullPath || fullPath.hasSuffix('/'));

    /* Parse file */
    bool multiLineValue = false;
    while(!in.isEmpty()) {
        const Containers::StringView currentLine = in;

        /* Extract the line and ignore the newline character after it, if any */
        Containers::StringView buffer = in;
        const Containers::StringView end = in.findOr('\n', in.end());
        buffer = in.prefix(end.begin());
        in = in.suffix(end.end());

        /* Windows EOL */
        if(buffer.hasSuffix('\r'))
            _flags |= InternalFlag::WindowsEol;

        /* Multi-line value */
        if(multiLineValue) {
            /* End of multi-line value */
            if(Containers::StringView{buffer}.trimmed() == "\"\"\""_s) {
                /* Remove trailing newline, if present */
                if(!group->_values.back().value.empty()) {
                    CORRADE_INTERNAL_ASSERT(group->_values.back().value.back() == '\n');
                    group->_values.back().value.resize(group->_values.back().value.size()-1);
                }

                multiLineValue = false;
                continue;
            }

            /* Remove Windows EOL, if present */
            if(buffer.hasSuffix('\r')) buffer = buffer.exceptSuffix(1);

            /* Append it (with newline) to current value */
            group->_values.back().value += buffer;
            group->_values.back().value += '\n';
            continue;
        }

        /* Trim buffer */
        buffer = buffer.trimmed();

        /* Empty line */
        if(!buffer) {
            if(_flags & InternalFlag::SkipComments) continue;

            /* Save it only if this is not the last one */
            if(in) group->_values.emplace_back();

        /* Group header */
        } else if(buffer.hasPrefix('[')) {

            /* Check ending bracket */
            if(!buffer.hasSuffix(']'))
                return {nullptr, "missing closing bracket for a group header"};

            const Containers::StringView nextGroup = buffer.slice(1, buffer.size()-1).trimmed();

            if(!nextGroup)
                return {nullptr, "empty group name"};

            /* This is a subgroup of this one, parse recursively */
            if(nextGroup.hasPrefix(fullPath)) {
                ConfigurationGroup::Group g;

                /* If the subgroup has a shorthand for multiple nesting, call
                   parse() on this same line again but with nested group and
                   larger fullPath */
                const Containers::StringView nextSubGroup = nextGroup.exceptPrefix(fullPath);
                if(const Containers::StringView groupEnd = nextSubGroup.find('/')) {
                    if(groupEnd.begin() == nextSubGroup.begin())
                        return {nullptr, "empty subgroup name"};

                    g.name = nextSubGroup.prefix(groupEnd.begin());
                    g.group = new ConfigurationGroup(_configuration);
                    /* Add the group before attempting any other parsing, as it
                       could throw an exception and the group would otherwise
                       be leaked */
                    group->_groups.push_back(std::move(g));
                    std::pair<Containers::ArrayView<const char>, const char*> parsed = parse(currentLine, g.group, nextGroup.prefix(groupEnd .end()));
                    if(parsed.second) return parsed; /* Error, bubble up */
                    in = parsed.first;

                /* Otherwise call parse() on the next line */
                } else {
                    g.name = nextSubGroup;
                    g.group = new ConfigurationGroup(_configuration);
                    /* Add the group before attempting any other parsing, as it
                       could throw an exception and the group would otherwise
                       be leaked */
                    group->_groups.push_back(std::move(g));
                    std::pair<Containers::ArrayView<const char>, const char*> parsed = parse(in, g.group, nextGroup + "/"_s);
                    if(parsed.second) return parsed; /* Error, bubble up */
                    in = parsed.first;
                }

            /* Otherwise it's a subgroup of some parent, return the control
               back to caller (again with this line) */
            } else return {currentLine, nullptr};

        /* Comment */
        } else if(buffer[0] == '#' || buffer[0] == ';') {
            if(_flags & InternalFlag::SkipComments) continue;

            ConfigurationGroup::Value item;
            item.value = buffer;
            group->_values.push_back(item);

        /* Key/value pair */
        } else {
            const Containers::Array3<Containers::StringView> keyValue = buffer.partition('=');
            if(!keyValue[1])
                return {nullptr, "missing equals for a value"};

            ConfigurationGroup::Value item;
            item.key = keyValue[0].trimmed();
            item.value = keyValue[2].trimmed();

            /* Start of multi-line value */
            if(item.value == "\"\"\"") {
                item.value = "";
                multiLineValue = true;

            /* Remove quotes, if present */
            /** @todo Check `"` characters better */
            } else if(!item.value.empty() && item.value[0] == '"') {
                if(item.value.size() < 2 || item.value[item.value.size()-1] != '"')
                    return {nullptr, "missing closing quote for a value"};

                item.value = item.value.substr(1, item.value.size()-2);
            }

            group->_values.push_back(item);
        }
    }

    if(multiLineValue)
        return {nullptr, "missing closing quotes for a multi-line value"};

    /* This was the last group */
    return {in, nullptr};
}